

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O1

void __thiscall
xray_re::xr_ogf_v3::motion_io::import_params
          (motion_io *this,xr_ini_file *ini,ogf3_motion_type motion_type,char *section,char *name,
          xr_ogf_v3 *ogf)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  xr_bone *pxVar6;
  undefined8 uVar7;
  uint16_t uVar8;
  float fVar9;
  allocator<char> local_51;
  string local_50;
  
  if (motion_type == SMT_CYCLE) {
    pcVar4 = xr_ini_file::r_string(ini,section,"part");
    pcVar5 = strstr(pcVar4,"--none--");
    if (pcVar5 != (char *)0x0) {
      uVar3 = 0;
      uVar8 = 0xffff;
      goto LAB_00181289;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar4,&local_51);
    pxVar6 = (xr_bone *)xr_object::find_partition((xr_object *)ogf,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (pxVar6 == (xr_bone *)0x0) {
      pcVar5 = "unknown partition %s in motion %s";
      goto LAB_0018134f;
    }
    uVar3 = 0;
  }
  else {
    pcVar4 = xr_ini_file::r_string(ini,section,"bone");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar4,&local_51);
    pxVar6 = xr_object::find_bone((xr_object *)ogf,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (pxVar6 == (xr_bone *)0x0) {
      pcVar5 = "unknown bone %s in motion %s";
LAB_0018134f:
      msg(pcVar5,pcVar4,name);
      uVar7 = __cxa_allocate_exception(1);
      __cxa_throw(uVar7,&xr_error::typeinfo,0);
    }
    uVar3 = 1;
  }
  uVar8 = pxVar6->m_id;
LAB_00181289:
  (this->super_xr_skl_motion).m_bone_or_part = uVar8;
  (this->super_xr_skl_motion).m_flags = uVar3;
  fVar9 = xr_ini_file::r_float(ini,section,"speed");
  (this->super_xr_skl_motion).m_speed = fVar9;
  fVar9 = xr_ini_file::r_float(ini,section,"power");
  (this->super_xr_skl_motion).m_power = fVar9;
  fVar9 = xr_ini_file::r_float(ini,section,"accrue");
  (this->super_xr_skl_motion).m_accrue = fVar9;
  fVar9 = xr_ini_file::r_float(ini,section,"falloff");
  (this->super_xr_skl_motion).m_falloff = fVar9;
  bVar2 = xr_ini_file::r_bool(ini,section,"stop@end");
  if (bVar2) {
    puVar1 = &(this->super_xr_skl_motion).m_flags;
    *(byte *)puVar1 = (byte)*puVar1 | 2;
  }
  pcVar4 = (char *)(this->super_xr_skl_motion).super_xr_motion.m_name._M_string_length;
  strlen(name);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_xr_skl_motion).super_xr_motion.m_name,0,pcVar4,(ulong)name);
  return;
}

Assistant:

inline void xr_ogf_v3::motion_io::import_params(const xr_ini_file& ini, ogf3_motion_type motion_type,
		const char* section, const char* name, xr_ogf_v3& ogf)
{
	if (motion_type == SMT_CYCLE) {
		const char* part_name = ini.r_string(section, "part");
		if (strstr(part_name, "--none--") == 0) {
			xr_partition* part = ogf.find_partition(part_name);
			if (part == 0) {
				msg("unknown partition %s in motion %s", part_name, name);
				throw xr_error();
			}
			m_bone_or_part = part->id();
		} else {
			m_bone_or_part = ALL_PARTITIONS;
		}
		m_flags = 0;
	} else {
		const char* bone_name = ini.r_string(section, "bone");
		xr_bone* bone = ogf.find_bone(bone_name);
		if (bone == 0) {
			msg("unknown bone %s in motion %s", bone_name, name);
			throw xr_error();
		}
		m_bone_or_part = bone->id();
		m_flags = SMF_FX;
	}
	m_speed = ini.r_float(section, "speed");
	m_power = ini.r_float(section, "power");
	m_accrue = ini.r_float(section, "accrue");
	m_falloff = ini.r_float(section, "falloff");
	if (ini.r_bool(section, "stop@end"))
		m_flags |= SMF_STOP_AT_END;
//	else
//		m_flags &= ~SMF_STOP_AT_END;
	m_name = name;
}